

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcCom.c
# Opt level: O0

int Abc_CommandPs(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  Pla_Man_t *p_00;
  char *pcVar5;
  uint local_44;
  int fVerbose;
  int c;
  int fDistrib;
  int fShowAdder;
  int fShowMulti;
  Pla_Man_t *p;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  p_00 = Pla_AbcGetMan(pAbc);
  bVar1 = false;
  bVar2 = false;
  bVar3 = false;
  local_44 = 0;
  Extra_UtilGetoptReset();
LAB_004a9c13:
  iVar4 = Extra_UtilGetopt(argc,argv,"madvh");
  if (iVar4 == -1) {
    if (p_00 == (Pla_Man_t *)0x0) {
      Abc_Print(1,"Abc_CommandPs(): There is no current design.\n");
    }
    else {
      Pla_ManPrintStats(p_00,local_44);
    }
    return 0;
  }
  switch(iVar4) {
  case 0x61:
    bVar2 = (bool)(bVar2 ^ 1);
    goto LAB_004a9c13;
  default:
    break;
  case 100:
    bVar3 = (bool)(bVar3 ^ 1);
    goto LAB_004a9c13;
  case 0x68:
    break;
  case 0x6d:
    bVar1 = (bool)(bVar1 ^ 1);
    goto LAB_004a9c13;
  case 0x76:
    goto switchD_004a9c51_caseD_76;
  }
  Abc_Print(-2,"usage: |ps [-madvh]\n");
  Abc_Print(-2,"\t         prints statistics\n");
  pcVar5 = "no";
  if (bVar1) {
    pcVar5 = "yes";
  }
  Abc_Print(-2,"\t-m     : toggle printing multipliers [default = %s]\n",pcVar5);
  pcVar5 = "no";
  if (bVar2) {
    pcVar5 = "yes";
  }
  Abc_Print(-2,"\t-a     : toggle printing adders [default = %s]\n",pcVar5);
  pcVar5 = "no";
  if (bVar3) {
    pcVar5 = "yes";
  }
  Abc_Print(-2,"\t-d     : toggle printing distrubition [default = %s]\n",pcVar5);
  pcVar5 = "no";
  if (local_44 != 0) {
    pcVar5 = "yes";
  }
  Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar5);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  return 1;
switchD_004a9c51_caseD_76:
  local_44 = local_44 ^ 1;
  goto LAB_004a9c13;
}

Assistant:

int Abc_CommandPs( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Wlc_Ntk_t * pNtk = Wlc_AbcGetNtk(pAbc);
    int fShowCones   = 0;
    int fShowMulti   = 0;
    int fShowAdder   = 0;
    int fShowMem     = 0;
    int fDistrib     = 0;
    int fTwoSides    = 0;
    int fAllObjects  = 0;
    int c, fVerbose  = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "cbamdtovh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'c':
            fShowCones ^= 1;
            break;
        case 'b':
            fShowMulti ^= 1;
            break;
        case 'a':
            fShowAdder ^= 1;
            break;
        case 'm':
            fShowMem ^= 1;
            break;
        case 'd':
            fDistrib ^= 1;
            break;
        case 't':
            fTwoSides ^= 1;
            break;
        case 'o':
            fAllObjects ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( 1, "Abc_CommandPs(): There is no current design.\n" );
        return 0;
    }
    Wlc_NtkPrintStats( pNtk, fDistrib, fTwoSides, fVerbose );
    if ( fShowCones )
        Wlc_NtkProfileCones( pNtk ); 
    if ( fShowMulti )
        Wlc_NtkPrintNodes( pNtk, WLC_OBJ_ARI_MULTI );
    if ( fShowAdder )
        Wlc_NtkPrintNodes( pNtk, WLC_OBJ_ARI_ADD );
    if ( fShowMem )
        Wlc_NtkPrintMemory( pNtk );
    if ( fAllObjects )
        Wlc_NtkPrintObjects( pNtk );
    return 0;
usage:
    Abc_Print( -2, "usage: %%ps [-cbamdtovh]\n" );
    Abc_Print( -2, "\t         prints statistics\n" );
    Abc_Print( -2, "\t-c     : toggle printing cones [default = %s]\n",                 fShowCones? "yes": "no" );
    Abc_Print( -2, "\t-b     : toggle printing multipliers [default = %s]\n",           fShowMulti? "yes": "no" );
    Abc_Print( -2, "\t-a     : toggle printing adders [default = %s]\n",                fShowAdder? "yes": "no" );
    Abc_Print( -2, "\t-m     : toggle printing memories [default = %s]\n",              fShowMem?   "yes": "no" );
    Abc_Print( -2, "\t-d     : toggle printing distrubition [default = %s]\n",          fDistrib?   "yes": "no" );
    Abc_Print( -2, "\t-t     : toggle printing stats for LHS and RHS [default = %s]\n", fTwoSides?  "yes": "no" );
    Abc_Print( -2, "\t-o     : toggle printing all objects [default = %s]\n",           fAllObjects?"yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n",   fVerbose?   "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}